

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O0

String * __thiscall
Diligent::BasicPlatformDebug::FormatAssertionFailedMessage_abi_cxx11_
          (String *__return_storage_ptr__,BasicPlatformDebug *this,char *Message,char *Function,
          char *File,int Line)

{
  char **in_stack_ffffffffffffff50;
  allocator local_71;
  String local_70;
  undefined1 local_50 [8];
  String FileName;
  int Line_local;
  char *File_local;
  char *Function_local;
  char *Message_local;
  
  FileName.field_2._12_4_ = SUB84(File,0);
  File_local = Message;
  Function_local = (char *)this;
  Message_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,Function,&local_71);
  BasicFileSystem::GetPathComponents(&local_70,(String *)0x0,(String *)local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  FormatString<char[27],char_const*,char[10],std::__cxx11::string,char[8],int,char[3],char_const*>
            (__return_storage_ptr__,(Diligent *)"Debug assertion failed in ",
             (char (*) [27])&File_local,(char **)"(), file ",(char (*) [10])local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", line ",
             (char (*) [8])((long)&FileName.field_2 + 0xc),(int *)0xee94e8,
             (char (*) [3])&Function_local,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

String BasicPlatformDebug::FormatAssertionFailedMessage(const char* Message,
                                                        const char* Function, // type of __FUNCTION__
                                                        const char* File,     // type of __FILE__
                                                        int         Line)
{
    String FileName;
    BasicFileSystem::GetPathComponents(File, nullptr, &FileName);
    return FormatString("Debug assertion failed in ", Function, "(), file ", FileName, ", line ", Line, ":\n", Message);
}